

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

string * vera::toString<int>(string *__return_storage_ptr__,int *_value,int _precision,int _width,
                            char _fill)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  _Setprecision _Var3;
  undefined8 uVar4;
  ostream *poVar5;
  ostringstream local_1a0 [8];
  ostringstream out;
  char _fill_local;
  int _width_local;
  int _precision_local;
  int *_value_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  uVar4 = std::ostream::operator<<(local_1a0,std::fixed);
  _Var1 = std::setfill<char>(_fill);
  poVar5 = std::operator<<(uVar4,_Var1._M_c);
  _Var2 = std::setw(_width);
  poVar5 = std::operator<<(poVar5,_Var2);
  _Var3 = std::setprecision(_precision);
  poVar5 = std::operator<<(poVar5,_Var3);
  std::ostream::operator<<(poVar5,*_value);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

inline std::string toString(const T& _value, int _precision, int _width, char _fill) {
    std::ostringstream out;
    out << std::fixed << std::setfill(_fill) << std::setw(_width) << std::setprecision(_precision) << _value;
    return out.str();
}